

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

void FStateDefinitions::RetargetStatePointers
               (intptr_t count,char *target,TArray<FStateDefine,_FStateDefine> *statelist)

{
  char *pcVar1;
  FStateDefine *pFVar2;
  long lVar3;
  ulong uVar4;
  
  if (statelist->Count != 0) {
    lVar3 = 0x20;
    uVar4 = 0;
    do {
      pFVar2 = statelist->Array;
      if ((*(long *)((long)pFVar2 + lVar3 + -8) == count) &&
         (*(char *)((long)&(pFVar2->Label).Index + lVar3) == '\x05')) {
        if (target == (char *)0x0) {
          *(undefined8 *)((long)pFVar2 + lVar3 + -8) = 0;
          *(undefined1 *)((long)&(pFVar2->Label).Index + lVar3) = 2;
        }
        else {
          pcVar1 = copystring(target);
          pFVar2 = statelist->Array;
          *(char **)((long)pFVar2 + lVar3 + -8) = pcVar1;
          *(undefined1 *)((long)&(pFVar2->Label).Index + lVar3) = 4;
        }
      }
      if (*(int *)((long)pFVar2 + lVar3 + -0xc) != 0) {
        RetargetStatePointers
                  (count,target,(TArray<FStateDefine,_FStateDefine> *)((long)pFVar2 + lVar3 + -0x18)
                  );
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar4 < statelist->Count);
  }
  return;
}

Assistant:

void FStateDefinitions::RetargetStatePointers (intptr_t count, const char *target, TArray<FStateDefine> & statelist)
{
	for(unsigned i = 0;i<statelist.Size(); i++)
	{
		if (statelist[i].State == (FState*)count && statelist[i].DefineFlags == SDF_INDEX)
		{
			if (target == NULL)
			{
				statelist[i].State = NULL;
				statelist[i].DefineFlags = SDF_STOP;
			}
			else
			{
				statelist[i].State = (FState *)copystring (target);
				statelist[i].DefineFlags = SDF_LABEL;
			}
		}
		if (statelist[i].Children.Size() > 0)
		{
			RetargetStatePointers(count, target, statelist[i].Children);
		}
	}
}